

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blt_gtest_smoke.cpp
# Opt level: O0

void __thiscall blt_gtest_smoke_death_test_Test::TestBody(blt_gtest_smoke_death_test_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *this_00;
  char *message;
  char *regex;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_30;
  pointer local_18;
  DeathTest *gtest_dt;
  blt_gtest_smoke_death_test_Test *this_local;
  
  gtest_dt = (DeathTest *)this;
  this_00 = std::operator<<((ostream *)&std::cout,
                            "Note: Death tests disabled in this configuration.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::operator=
            ((string *)testing::FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_0010bfc5;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_(&local_30,(internal *)0x1683f3,regex);
  bVar1 = testing::internal::DeathTest::Create
                    ("exit(1)",&local_30,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/tests/smoke/blt_gtest_smoke.cpp"
                     ,0x21,&local_18);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_30);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0010bfc5;
  if (local_18 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel,local_18);
  iVar2 = (*local_18->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_18->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_18->_vptr_DeathTest[4])(local_18,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_0010bf93;
    local_7c = 2;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                ((ReturnSentinel *)&gtest_exception,local_18);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        exit(1);
      }
      (*local_18->_vptr_DeathTest[5])(local_18,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                ((ReturnSentinel *)&gtest_exception);
    }
LAB_0010bf93:
    local_7c = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel);
  if (local_7c == 0) {
    return;
  }
LAB_0010bfc5:
  testing::Message::Message(&local_88);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/tests/smoke/blt_gtest_smoke.cpp"
             ,0x21,message);
  testing::internal::AssertHelper::operator=(&local_90,&local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::Message::~Message(&local_88);
  return;
}

Assistant:

TEST(blt_gtest_smoke,death_test)
{
  #if (GTEST_HAS_DEATH_TEST == 0)
  std::cout <<"Note: Death tests disabled in this configuration." << std::endl;
  #endif

  // Invoke death test function whether death tests enabled or disabled.
  ::testing::FLAGS_gtest_death_test_style = "threadsafe";
  EXPECT_DEATH_IF_SUPPORTED( exit(1), "");
}